

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*>::emplace<QPropertyAnimation*const&>
          (QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*> *this,
          pair<QObject_*,_QByteArray> *key,QPropertyAnimation **args)

{
  Data *pDVar1;
  Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
LAB_003b894e:
    pDVar2 = *(Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> **)
              this;
    local_28.d = pDVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>
                    *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::
               Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>::
               detached(pDVar2);
      *(Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> **)this =
           pDVar2;
    }
    pVar3 = (piter)emplace_helper<QPropertyAnimation*const&>(this,key,args);
    QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::~QHash(&local_28);
  }
  else {
    if (1 < *(uint *)&(((QVariantAnimation *)&pDVar1->ref)->super_QAbstractAnimation).super_QObject.
                      _vptr_QObject) {
      if ((pDVar1 != (Data *)0x0) &&
         (*(int *)&(((QVariantAnimation *)&pDVar1->ref)->super_QAbstractAnimation).super_QObject.
                   _vptr_QObject != -1)) {
        LOCK();
        *(int *)&(((QVariantAnimation *)&pDVar1->ref)->super_QAbstractAnimation).super_QObject.
                 _vptr_QObject =
             *(int *)&(((QVariantAnimation *)&pDVar1->ref)->super_QAbstractAnimation).super_QObject.
                      _vptr_QObject + 1;
        UNLOCK();
      }
      goto LAB_003b894e;
    }
    if (((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)&pDVar1->size)->d <
        (QObjectData *)(pDVar1->numBuckets >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QPropertyAnimation*const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_003b89e4;
    }
    local_28.d = (Data *)*args;
    pVar3 = (piter)emplace_helper<QPropertyAnimation*>(this,key,(QPropertyAnimation **)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_003b89e4:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }